

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

int symbol_add_function(lgx_ast_t *ast,lgx_ast_node_t *node)

{
  int iVar1;
  bool bVar2;
  lgx_symbol_t *local_40;
  lgx_symbol_t *symbol;
  int ret;
  uint uStack_2c;
  uchar is_global;
  lgx_str_t name;
  lgx_ast_node_t *node_local;
  lgx_ast_t *ast_local;
  
  name.buffer = (char *)node;
  if (node->children != 5) {
    __assert_fail("node->children == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1ae,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)*node->child != ',') {
    __assert_fail("node->child[0]->type == FUNCTION_RECEIVER",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1af,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)node->child[1] != '#') {
    __assert_fail("node->child[1]->type == IDENTIFIER_TOKEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1b0,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)node->child[2] == '\x1b') {
    if (*(char *)node->child[3] != '\"') {
      __assert_fail("node->child[3]->type == TYPE_EXPRESSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x1b2,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
    }
    if (*(char *)node->child[4] == '\x01') {
      name._0_8_ = (ast->lex).source.content + node->child[1]->offset;
      uStack_2c = node->child[1]->length;
      ret = 0;
      symbol._7_1_ = '\0';
      if (((node->parent != (lgx_ast_node_s *)0x0) && (*(char *)node->parent == '\x01')) &&
         (node->parent->parent == (lgx_ast_node_s *)0x0)) {
        symbol._7_1_ = '\x01';
      }
      local_40 = (lgx_symbol_t *)0x0;
      bVar2 = *(char *)node->parent != '\x01';
      if (bVar2) {
        symbol_error(ast,node,"[invalid function declaration] %.*s\n",(ulong)uStack_2c,name._0_8_);
      }
      else {
        local_40 = symbol_add(ast,node,(node->parent->u).symbols,S_CONSTANT,(lgx_str_t *)&ret,
                              symbol._7_1_);
      }
      symbol._0_4_ = (uint)bVar2;
      if (local_40 == (lgx_symbol_t *)0x0) {
        ast_local._4_4_ = 1;
      }
      else {
        iVar1 = lgx_type_init(&local_40->type,T_FUNCTION);
        if (iVar1 == 0) {
          iVar1 = symbol_parse_type_function_receiver
                            (ast,(lgx_ast_node_t *)**(undefined8 **)(name.buffer + 0x18),
                             (lgx_type_function_t *)(local_40->type).u.arr);
          if (iVar1 != 0) {
            symbol._0_4_ = 1;
          }
          iVar1 = symbol_parse_type_function_parameter
                            (ast,*(lgx_ast_node_t **)(*(long *)(name.buffer + 0x18) + 0x10),
                             (lgx_type_function_t *)(local_40->type).u.arr);
          if (iVar1 != 0) {
            symbol._0_4_ = 1;
          }
          iVar1 = symbol_parse_type_function_return
                            (ast,*(lgx_ast_node_t **)(*(long *)(name.buffer + 0x18) + 0x18),
                             (lgx_type_function_t *)(local_40->type).u.arr);
          if (iVar1 != 0) {
            symbol._0_4_ = 1;
          }
          ast_local._4_4_ = (uint)symbol;
        }
        else {
          symbol_error(ast,(lgx_ast_node_t *)name.buffer,"out of memory\n");
          ast_local._4_4_ = 1;
        }
      }
      return ast_local._4_4_;
    }
    __assert_fail("node->child[4]->type == BLOCK_STATEMENT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x1b3,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
  }
  __assert_fail("node->child[2]->type == FUNCTION_DECL_PARAMETER",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                ,0x1b1,"int symbol_add_function(lgx_ast_t *, lgx_ast_node_t *)");
}

Assistant:

static int symbol_add_function(lgx_ast_t* ast, lgx_ast_node_t* node) {
    assert(node->children == 5);
    assert(node->child[0]->type == FUNCTION_RECEIVER);
    assert(node->child[1]->type == IDENTIFIER_TOKEN);
    assert(node->child[2]->type == FUNCTION_DECL_PARAMETER);
    assert(node->child[3]->type == TYPE_EXPRESSION);
    assert(node->child[4]->type == BLOCK_STATEMENT);

    // TODO 是否为成员函数

    // 函数名称标识符
    lgx_str_t name;
    name.buffer = ast->lex.source.content + node->child[1]->offset;
    name.length = node->child[1]->length;
    name.size = 0;

    // 是否全局函数
    unsigned char is_global = 0;
    if (node->parent && node->parent->type == BLOCK_STATEMENT && node->parent->parent == NULL) {
        is_global = 1;
    }

    int ret = 0;
    lgx_symbol_t* symbol = NULL;

    switch (node->parent->type) {
        case BLOCK_STATEMENT: { // 在块作用域内定义函数
            // 添加函数到该块作用域中
            symbol = symbol_add(ast, node,
                node->parent->u.symbols, S_CONSTANT,
                &name, is_global);
            break;
        }
        default:
            symbol_error(ast, node, "[invalid function declaration] %.*s\n", name.length, name.buffer);
            ret = 1;
    }

    if (!symbol) {
        return 1;
    }

    if (lgx_type_init(&symbol->type, T_FUNCTION)) {
        symbol_error(ast, node, "out of memory\n");
        return 1;
    }

    // 解析接收者
    if (symbol_parse_type_function_receiver(ast, node->child[0], symbol->type.u.fun)) {
        ret = 1;
    }

    // 解析参数列表
    if (symbol_parse_type_function_parameter(ast, node->child[2], symbol->type.u.fun)) {
        ret = 1;
    }

    // 解析返回值
    if (symbol_parse_type_function_return(ast, node->child[3], symbol->type.u.fun)) {
        ret = 1;
    }

    return ret;
}